

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::text_format_unittest::AbslStringifyTest_StringifyHasRedactionMarker_Test::
AbslStringifyTest_StringifyHasRedactionMarker_Test
          (AbslStringifyTest_StringifyHasRedactionMarker_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_0163be38;
  return;
}

Assistant:

TEST(AbslStringifyTest, StringifyHasRedactionMarker) {
  unittest::TestAllTypes proto;
  proto.set_optional_int32(1);
  proto.set_optional_string("foo");

  EXPECT_THAT(absl::StrCat(proto), testing::MatchesRegex(absl::Substitute(
                                       "$0\n"
                                       "optional_int32: 1\n"
                                       "optional_string: \"foo\"\n",
                                       kTextMarkerRegex)));
}